

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O1

bool CoreML::Specification::TreeEnsembleParameters_TreeNode_TreeNodeBehavior_Parse
               (ConstStringParam name,TreeEnsembleParameters_TreeNode_TreeNodeBehavior *value)

{
  pointer size;
  char *size_00;
  bool bVar1;
  int *in_R9;
  StringPiece name_00;
  int int_value;
  TreeEnsembleParameters_TreeNode_TreeNodeBehavior local_1c;
  
  size = (name->_M_dataplus)._M_p;
  size_00 = (char *)name->_M_string_length;
  if ((long)size_00 < 0) {
    google::protobuf::stringpiece_internal::StringPiece::LogFatalSizeTooBig
              ((size_t)size_00,"string length exceeds max size");
  }
  name_00.length_ = (size_type)&local_1c;
  name_00.ptr_ = size_00;
  bVar1 = google::protobuf::internal::LookUpEnumValue
                    ((internal *)TreeEnsembleParameters_TreeNode_TreeNodeBehavior_entries,
                     (EnumEntry *)0x7,(size_t)size,name_00,in_R9);
  if (bVar1) {
    *value = local_1c;
  }
  return bVar1;
}

Assistant:

bool TreeEnsembleParameters_TreeNode_TreeNodeBehavior_Parse(
    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, TreeEnsembleParameters_TreeNode_TreeNodeBehavior* value) {
  int int_value;
  bool success = ::PROTOBUF_NAMESPACE_ID::internal::LookUpEnumValue(
      TreeEnsembleParameters_TreeNode_TreeNodeBehavior_entries, 7, name, &int_value);
  if (success) {
    *value = static_cast<TreeEnsembleParameters_TreeNode_TreeNodeBehavior>(int_value);
  }
  return success;
}